

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_mesh * rf_gen_mesh_heightmap
                    (rf_mesh *__return_storage_ptr__,rf_image heightmap,rf_vec3 size,
                    rf_allocator allocator,rf_allocator temp_allocator)

{
  float *pfVar1;
  float *pfVar2;
  rf_source_location rVar3;
  rf_source_location rVar4;
  rf_source_location rVar5;
  rf_source_location rVar6;
  rf_source_location rVar7;
  rf_allocator_args rVar8;
  rf_allocator_args rVar9;
  rf_image image;
  undefined1 auVar10 [24];
  undefined1 auVar11 [24];
  undefined1 auVar12 [24];
  int iVar13;
  int iVar14;
  uint *puVar15;
  rf_color *prVar16;
  float *pfVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  float *pfVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  float fVar29;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  rf_allocator local_158;
  void *pvVar40;
  rf_allocator allocator_00;
  uint uStack_11c;
  uint uStack_ec;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  uint uStack_8c;
  uint uStack_5c;
  rf_allocator local_40;
  
  local_158.allocator_proc = temp_allocator.allocator_proc;
  local_158.user_data = temp_allocator.user_data;
  local_40.allocator_proc = allocator.allocator_proc;
  local_40.user_data = allocator.user_data;
  allocator_00.allocator_proc._0_4_ = in_XMM0_Dc;
  allocator_00.user_data = (void *)size._0_8_;
  allocator_00.allocator_proc._4_4_ = in_XMM0_Dd;
  *(undefined8 *)&__return_storage_ptr__->vao_id = 0;
  __return_storage_ptr__->vbo_id = (uint *)0x0;
  __return_storage_ptr__->bone_ids = (int *)0x0;
  __return_storage_ptr__->bone_weights = (float *)0x0;
  __return_storage_ptr__->anim_vertices = (float *)0x0;
  __return_storage_ptr__->anim_normals = (float *)0x0;
  __return_storage_ptr__->colors = (uchar *)0x0;
  __return_storage_ptr__->indices = (unsigned_short *)0x0;
  __return_storage_ptr__->normals = (float *)0x0;
  __return_storage_ptr__->tangents = (float *)0x0;
  __return_storage_ptr__->texcoords = (float *)0x0;
  __return_storage_ptr__->texcoords2 = (float *)0x0;
  __return_storage_ptr__->vertex_count = 0;
  __return_storage_ptr__->triangle_count = 0;
  __return_storage_ptr__->vertices = (float *)0x0;
  lVar23 = 0;
  rVar3.proc_name = "rf_gen_mesh_heightmap";
  rVar3.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar3.line_in_file = 0x891d;
  rVar8._16_8_ = (ulong)uStack_5c << 0x20;
  rVar8.pointer_to_free_or_realloc = (void *)SUB168(ZEXT816(0x1c) << 0x40,0);
  rVar8.size_to_allocate_or_reallocate = SUB168(ZEXT816(0x1c) << 0x40,8);
  puVar15 = (uint *)(*local_40.allocator_proc)(&local_40,rVar3,RF_AM_ALLOC,rVar8);
  pvVar40 = allocator_00.user_data;
  __return_storage_ptr__->vbo_id = puVar15;
  puVar15[0] = 0;
  puVar15[1] = 0;
  puVar15[2] = 0;
  puVar15[3] = 0;
  puVar15[3] = 0;
  puVar15[4] = 0;
  puVar15[5] = 0;
  puVar15[6] = 0;
  image.width = (int)in_stack_ffffffffffffff38;
  image.height = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  image.data = (void *)in_stack_ffffffffffffff30;
  image.format = in_stack_ffffffffffffff40;
  image._20_4_ = in_stack_ffffffffffffff44;
  prVar16 = rf_image_pixels_to_rgba32(image,allocator_00);
  iVar18 = heightmap.width + -1;
  iVar13 = heightmap.height + -1;
  iVar14 = iVar13 * iVar18;
  __return_storage_ptr__->triangle_count = iVar14 * 2;
  __return_storage_ptr__->vertex_count = iVar14 * 6;
  rVar4.proc_name = "rf_gen_mesh_heightmap";
  rVar4.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar4.line_in_file = 0x892a;
  auVar10._8_8_ = (ulong)uStack_8c << 0x20;
  auVar10._0_8_ = (long)(iVar14 * 0x12) << 2;
  auVar10._16_8_ = 0;
  pfVar17 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar4,RF_AM_ALLOC,(rf_allocator_args)(auVar10 << 0x40));
  __return_storage_ptr__->vertices = pfVar17;
  rVar5.proc_name = "rf_gen_mesh_heightmap";
  rVar5.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar5.line_in_file = 0x892b;
  auVar11._8_8_ = (ulong)in_stack_ffffffffffffff44 << 0x20;
  auVar11._0_8_ = (long)__return_storage_ptr__->vertex_count * 0xc;
  auVar11._16_8_ = 0;
  pfVar17 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar5,RF_AM_ALLOC,(rf_allocator_args)(auVar11 << 0x40));
  __return_storage_ptr__->normals = pfVar17;
  rVar6.proc_name = "rf_gen_mesh_heightmap";
  rVar6.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar6.line_in_file = 0x892c;
  auVar12._8_8_ = (ulong)uStack_ec << 0x20;
  auVar12._0_8_ = (long)__return_storage_ptr__->vertex_count << 3;
  auVar12._16_8_ = 0;
  pfVar17 = (float *)(*local_40.allocator_proc)
                               (&local_40,rVar6,RF_AM_ALLOC,(rf_allocator_args)(auVar12 << 0x40));
  __return_storage_ptr__->texcoords = pfVar17;
  __return_storage_ptr__->colors = (uchar *)0x0;
  if (1 < heightmap.height) {
    fVar39 = (float)((ulong)pvVar40 >> 0x20) / 255.0;
    fVar29 = SUB84(pvVar40,0) / (float)heightmap.width;
    fVar38 = size.z / (float)heightmap.height;
    pfVar1 = __return_storage_ptr__->vertices;
    pfVar2 = __return_storage_ptr__->normals;
    lVar20 = 0;
    lVar25 = 0;
    lVar26 = 0;
    do {
      if (1 < heightmap.width) {
        lVar28 = lVar20 * heightmap.width;
        fVar31 = (float)(lVar20 + 1);
        fVar32 = fVar38 * (float)lVar20;
        lVar27 = (lVar20 + 1) * (long)heightmap.width;
        fVar33 = fVar38 * fVar31;
        fVar30 = (float)lVar20 / (float)iVar13;
        fVar31 = fVar31 / (float)iVar13;
        lVar23 = (long)(int)lVar23;
        lVar25 = (long)(int)lVar25;
        lVar26 = (long)(int)lVar26;
        pfVar24 = pfVar2 + lVar26 + 2;
        lVar21 = 0;
        do {
          fVar34 = fVar29 * (float)lVar21;
          pfVar1[lVar23] = fVar34;
          pfVar1[lVar23 + 1] =
               (float)(((uint)prVar16[lVar21 + lVar28].b +
                       (uint)prVar16[lVar21 + lVar28].g + (uint)prVar16[lVar21 + lVar28].r) / 3) *
               fVar39;
          pfVar1[lVar23 + 2] = fVar32;
          pfVar1[lVar23 + 3] = fVar34;
          fVar35 = (float)(((uint)prVar16[lVar21 + lVar27].b +
                           (uint)prVar16[lVar21 + lVar27].g + (uint)prVar16[lVar21 + lVar27].r) / 3)
                   * fVar39;
          pfVar1[lVar23 + 4] = fVar35;
          pfVar1[lVar23 + 5] = fVar33;
          lVar22 = lVar21 + 1;
          fVar36 = fVar29 * (float)lVar22;
          pfVar1[lVar23 + 6] = fVar36;
          fVar37 = (float)(((uint)prVar16[lVar21 + lVar28 + 1].b +
                           (uint)prVar16[lVar21 + lVar28 + 1].g +
                           (uint)prVar16[lVar21 + lVar28 + 1].r) / 3) * fVar39;
          pfVar1[lVar23 + 7] = fVar37;
          pfVar1[lVar23 + 8] = fVar32;
          pfVar1[lVar23 + 9] = fVar36;
          pfVar1[lVar23 + 10] = fVar37;
          pfVar1[lVar23 + 0xb] = fVar32;
          pfVar1[lVar23 + 0xc] = fVar34;
          pfVar1[lVar23 + 0xd] = fVar35;
          pfVar1[lVar23 + 0xe] = fVar33;
          pfVar1[lVar23 + 0xf] = fVar36;
          pfVar1[lVar23 + 0x10] =
               (float)(((uint)prVar16[lVar21 + lVar27 + 1].b +
                       (uint)prVar16[lVar21 + lVar27 + 1].g + (uint)prVar16[lVar21 + lVar27 + 1].r)
                      / 3) * fVar39;
          pfVar1[lVar23 + 0x11] = fVar33;
          fVar34 = (float)lVar21 / (float)iVar18;
          pfVar17[lVar25] = fVar34;
          pfVar17[lVar25 + 1] = fVar30;
          pfVar17[lVar25 + 2] = fVar34;
          pfVar17[lVar25 + 3] = fVar31;
          fVar35 = (float)lVar22 / (float)iVar18;
          pfVar17[lVar25 + 4] = fVar35;
          pfVar17[lVar25 + 5] = fVar30;
          pfVar17[lVar25 + 6] = fVar35;
          pfVar17[lVar25 + 7] = fVar30;
          pfVar17[lVar25 + 8] = fVar34;
          pfVar17[lVar25 + 9] = fVar31;
          pfVar17[lVar25 + 10] = fVar35;
          pfVar17[lVar25 + 0xb] = fVar31;
          uVar19 = 0xfffffffffffffffd;
          do {
            (pfVar24 + uVar19 + 1)[0] = 0.0;
            (pfVar24 + uVar19 + 1)[1] = 1.0;
            pfVar24[uVar19 + 3] = 0.0;
            uVar19 = uVar19 + 3;
          } while (uVar19 < 0xf);
          lVar23 = lVar23 + 0x12;
          lVar25 = lVar25 + 0xc;
          lVar26 = lVar26 + 0x12;
          pfVar24 = pfVar24 + 0x12;
          lVar21 = lVar22;
        } while (lVar22 != iVar18);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != iVar13);
  }
  rVar7.proc_name = "rf_gen_mesh_heightmap";
  rVar7.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar7.line_in_file = 0x897e;
  rVar9.size_to_allocate_or_reallocate = 0;
  rVar9.pointer_to_free_or_realloc = prVar16;
  rVar9._16_8_ = (ulong)uStack_11c << 0x20;
  (*local_158.allocator_proc)(&local_158,rVar7,RF_AM_FREE,rVar9);
  rf_gfx_load_mesh(__return_storage_ptr__,false);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mesh rf_gen_mesh_heightmap(rf_image heightmap, rf_vec3 size, rf_allocator allocator, rf_allocator temp_allocator)
{
#define RF_GRAY_VALUE(c) ((c.r+c.g+c.b)/3)

    rf_mesh mesh = {0};
    mesh.vbo_id = (unsigned int*) RF_ALLOC(allocator, RF_MAX_MESH_VBO * sizeof(unsigned int));
    memset(mesh.vbo_id, 0, RF_MAX_MESH_VBO * sizeof(unsigned int));

    int map_x = heightmap.width;
    int map_z = heightmap.height;

    rf_color* pixels = rf_image_pixels_to_rgba32(heightmap, temp_allocator);

    // NOTE: One vertex per pixel
    mesh.triangle_count = (map_x - 1) * (map_z - 1) * 2; // One quad every four pixels

    mesh.vertex_count = mesh.triangle_count * 3;

    mesh.vertices  = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.normals   = (float*) RF_ALLOC(allocator, mesh.vertex_count * 3 * sizeof(float));
    mesh.texcoords = (float*) RF_ALLOC(allocator, mesh.vertex_count * 2 * sizeof(float));
    mesh.colors    = NULL;

    int vertex_pos_counter      = 0; // Used to count vertices float by float
    int vertex_texcoord_counter = 0; // Used to count texcoords float by float
    int n_counter               = 0; // Used to count normals float by float
    int tris_counter            = 0;

    rf_vec3 scale_factor = { size.x / map_x, size.y / 255.0f, size.z / map_z };

    for (rf_int z = 0; z < map_z-1; z++)
    {
        for (rf_int x = 0; x < map_x-1; x++)
        {
            // Fill vertices array with data
            //----------------------------------------------------------

            // one triangle - 3 vertex
            mesh.vertices[vertex_pos_counter    ] = (float) x * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 1] = (float) RF_GRAY_VALUE(pixels[x + z * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 2] = (float) z * scale_factor.z;

            mesh.vertices[vertex_pos_counter + 3] = (float) x * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 4] = (float) RF_GRAY_VALUE(pixels[x + (z + 1) * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 5] = (float) (z + 1) * scale_factor.z;

            mesh.vertices[vertex_pos_counter + 6] = (float)(x + 1) * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 7] = (float)RF_GRAY_VALUE(pixels[(x + 1) + z * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 8] = (float)z * scale_factor.z;

            // another triangle - 3 vertex
            mesh.vertices[vertex_pos_counter + 9 ] = mesh.vertices[vertex_pos_counter + 6];
            mesh.vertices[vertex_pos_counter + 10] = mesh.vertices[vertex_pos_counter + 7];
            mesh.vertices[vertex_pos_counter + 11] = mesh.vertices[vertex_pos_counter + 8];

            mesh.vertices[vertex_pos_counter + 12] = mesh.vertices[vertex_pos_counter + 3];
            mesh.vertices[vertex_pos_counter + 13] = mesh.vertices[vertex_pos_counter + 4];
            mesh.vertices[vertex_pos_counter + 14] = mesh.vertices[vertex_pos_counter + 5];

            mesh.vertices[vertex_pos_counter + 15] = (float)(x + 1) * scale_factor.x;
            mesh.vertices[vertex_pos_counter + 16] = (float)RF_GRAY_VALUE(pixels[(x + 1) + (z + 1) * map_x]) * scale_factor.y;
            mesh.vertices[vertex_pos_counter + 17] = (float)(z + 1) * scale_factor.z;
            vertex_pos_counter += 18; // 6 vertex, 18 floats

            // Fill texcoords array with data
            //--------------------------------------------------------------
            mesh.texcoords[vertex_texcoord_counter    ] = (float)x / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 1] = (float)z / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 2] = (float)x / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 3] = (float)(z + 1) / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 4] = (float)(x + 1) / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 5] = (float)z / (map_z - 1);

            mesh.texcoords[vertex_texcoord_counter + 6] = mesh.texcoords[vertex_texcoord_counter + 4];
            mesh.texcoords[vertex_texcoord_counter + 7] = mesh.texcoords[vertex_texcoord_counter + 5];

            mesh.texcoords[vertex_texcoord_counter + 8] = mesh.texcoords[vertex_texcoord_counter + 2];
            mesh.texcoords[vertex_texcoord_counter + 9] = mesh.texcoords[vertex_texcoord_counter + 3];

            mesh.texcoords[vertex_texcoord_counter + 10] = (float)(x + 1) / (map_x - 1);
            mesh.texcoords[vertex_texcoord_counter + 11] = (float)(z + 1) / (map_z - 1);

            vertex_texcoord_counter += 12; // 6 texcoords, 12 floats

            // Fill normals array with data
            //--------------------------------------------------------------
            for (rf_int i = 0; i < 18; i += 3)
            {
                mesh.normals[n_counter + i    ] = 0.0f;
                mesh.normals[n_counter + i + 1] = 1.0f;
                mesh.normals[n_counter + i + 2] = 0.0f;
            }

            // TODO: Calculate normals in an efficient way

            n_counter    += 18; // 6 vertex, 18 floats
            tris_counter += 2;
        }
    }

    RF_FREE(temp_allocator, pixels);

    // Upload vertex data to GPU (static mesh)
    rf_gfx_load_mesh(&mesh, false);

    return mesh;
}